

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Snake::to_corruct_direction(Snake *this,Direction *direction)

{
  Direction DVar1;
  Direction DVar2;
  
  DVar1 = *direction;
  DVar2 = this->last_move;
  if (DVar2 == RIGHT && DVar1 == LEFT) {
    *direction = RIGHT;
    return;
  }
  if (DVar1 == RIGHT && DVar2 == LEFT) {
    *direction = LEFT;
    return;
  }
  if (DVar2 == DOWN && DVar1 == UP) {
    *direction = DOWN;
    return;
  }
  if (DVar2 == UP && DVar1 == DOWN) {
    *direction = UP;
    return;
  }
  this->last_move = DVar1;
  return;
}

Assistant:

void Snake::to_corruct_direction(Direction& direction)
{
    // RIGHT
    if(direction == LEFT and last_move == RIGHT)
    {
        direction = RIGHT;
        return;
    }

    // LEFT
    if(direction == RIGHT and last_move == LEFT)
    {
        direction = LEFT;
        return;
    }

    // DOWN
    if(direction == UP and last_move == DOWN)
    {
        direction = DOWN;
        return;
    }

    // UP
    if(direction == DOWN and last_move == UP)
    {
        direction = UP;
        return;
    }
    last_move = direction;
}